

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Registry_impl.hpp
# Opt level: O0

bean_ptr<Person> *
hiberlite::Registry<Person>::createBeanPtr
          (bean_ptr<Person> *__return_storage_ptr__,bean_key *key,Person *obj)

{
  bool bVar1;
  real_bean<Person> *this;
  rb_pair<Person> *prVar2;
  logic_error *this_00;
  mapped_type *pprVar3;
  bean_key local_a8;
  undefined1 local_89;
  _Self local_88;
  _Self local_80;
  rb_pair<Person> *local_78;
  rb_pair<Person> *para;
  bean_key local_68;
  real_bean<Person> *local_50;
  real_bean<Person> *rb;
  bean_key local_38;
  Person *local_20;
  Person *obj_local;
  bean_key *key_local;
  bean_ptr<Person> *ans;
  
  local_20 = obj;
  obj_local = (Person *)key;
  key_local = (bean_key *)__return_storage_ptr__;
  if (key->id == -1) {
    bean_key::bean_key(&local_38,key);
    bean_ptr<Person>::bean_ptr(__return_storage_ptr__,&local_38,(rb_pair<Person> *)0x0);
    bean_key::~bean_key(&local_38);
  }
  else {
    this = (real_bean<Person> *)operator_new(0x28);
    para._7_1_ = 1;
    bean_key::bean_key(&local_68,key);
    real_bean<Person>::real_bean(this,&local_68,local_20);
    para._7_1_ = 0;
    bean_key::~bean_key(&local_68);
    local_50 = this;
    prVar2 = (rb_pair<Person> *)operator_new(0x18);
    rb_pair<Person>::rb_pair(prVar2,local_50);
    local_78 = prVar2;
    local_80._M_node =
         (_Base_ptr)
         std::
         map<hiberlite::bean_key,_hiberlite::rb_pair<Person>_*,_std::less<hiberlite::bean_key>,_std::allocator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<Person>_*>_>_>
         ::find((map<hiberlite::bean_key,_hiberlite::rb_pair<Person>_*,_std::less<hiberlite::bean_key>,_std::allocator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<Person>_*>_>_>
                 *)rbpairs,key);
    local_88._M_node =
         (_Base_ptr)
         std::
         map<hiberlite::bean_key,_hiberlite::rb_pair<Person>_*,_std::less<hiberlite::bean_key>,_std::allocator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<Person>_*>_>_>
         ::end((map<hiberlite::bean_key,_hiberlite::rb_pair<Person>_*,_std::less<hiberlite::bean_key>,_std::allocator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<Person>_*>_>_>
                *)rbpairs);
    bVar1 = std::operator!=(&local_80,&local_88);
    prVar2 = local_78;
    if (bVar1) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"bean already exists");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    pprVar3 = std::
              map<hiberlite::bean_key,_hiberlite::rb_pair<Person>_*,_std::less<hiberlite::bean_key>,_std::allocator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<Person>_*>_>_>
              ::operator[]((map<hiberlite::bean_key,_hiberlite::rb_pair<Person>_*,_std::less<hiberlite::bean_key>,_std::allocator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<Person>_*>_>_>
                            *)rbpairs,key);
    *pprVar3 = prVar2;
    local_89 = 0;
    bean_key::bean_key(&local_a8,key);
    bean_ptr<Person>::bean_ptr(__return_storage_ptr__,&local_a8,local_78);
    bean_key::~bean_key(&local_a8);
  }
  return __return_storage_ptr__;
}

Assistant:

bean_ptr<C> Registry<C>::createBeanPtr(bean_key key, C* obj)
{
	if(key.id==Database::NULL_ID)
		return bean_ptr<C>(key,NULL);

	real_bean<C>* rb=new real_bean<C>(key,obj);
	rb_pair<C>* para=new rb_pair<C>(rb);

	if( rbpairs.find(key)!=rbpairs.end() )
		throw std::logic_error("bean already exists");

	rbpairs[key]=para;

	bean_ptr<C> ans(key, para);
	return ans;
}